

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qownlanguagedata.cpp
# Opt level: O3

void loadCSSData(QMultiHash<char,_QLatin1String> *types,QMultiHash<char,_QLatin1String> *keywords,
                QMultiHash<char,_QLatin1String> *builtin,QMultiHash<char,_QLatin1String> *literals,
                QMultiHash<char,_QLatin1String> *other)

{
  if (cssDataInitialized == '\0') {
    initCSSData();
    cssDataInitialized = '\x01';
  }
  QMultiHash<char,_QLatin1String>::operator=(types,&css_types);
  QMultiHash<char,_QLatin1String>::operator=(keywords,&css_keywords);
  QMultiHash<char,_QLatin1String>::operator=(builtin,&css_builtin);
  QMultiHash<char,_QLatin1String>::operator=(literals,&css_literals);
  QMultiHash<char,_QLatin1String>::operator=(other,&css_other);
  return;
}

Assistant:

void loadCSSData(QMultiHash<char, QLatin1String> &types,
                 QMultiHash<char, QLatin1String> &keywords,
                 QMultiHash<char, QLatin1String> &builtin,
                 QMultiHash<char, QLatin1String> &literals,
                 QMultiHash<char, QLatin1String> &other) {
    if (!cssDataInitialized) {
        initCSSData();
        cssDataInitialized = true;
    }
    types = css_types;
    keywords = css_keywords;
    builtin = css_builtin;
    literals = css_literals;
    other = css_other;
}